

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O0

optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
 unodb::detail::olc_impl_helpers::
 add_or_choose_subtree<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::detail::olc_inode_16<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
           (olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
            *inode,byte key_byte,
           basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> k,value_view v,
           olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
           *db_instance,
           tree_depth<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_>
           depth,read_critical_section *node_critical_section,
           in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
           *node_in_parent,read_critical_section *parent_critical_section,
           olc_db_leaf_unique_ptr<std::span<const_std::byte>,_std::span<const_std::byte>_>
           *cached_leaf)

{
  optimistic_lock *this;
  value_view v_00;
  basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> k_00;
  uchar children_count_;
  bool bVar1;
  pointer poVar2;
  atomic<long> *paVar3;
  version_type other;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar4;
  find_result fVar5;
  optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
  oVar6;
  write_guard local_180;
  write_guard write_unlock_on_exit;
  write_guard local_168;
  write_guard node_write_guard;
  write_guard local_158;
  write_guard write_unlock_on_exit_1;
  db_inode_unique_ptr<unodb::detail::olc_inode_48<std::span<const_std::byte>,_std::span<const_std::byte>_>_>
  larger_node;
  uchar children_count;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *local_108;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
  *child_in_parent;
  basic_inode_16<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
  *pbStack_f8;
  byte key_byte_local;
  olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *inode_local;
  pointer pbStack_e8;
  tree_depth<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_>
  depth_local;
  value_view v_local;
  basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> k_local;
  undefined1 local_c0;
  bool result;
  bool result_1;
  bool result_2;
  version_type local_68;
  long local_60;
  __int_type_conflict old_value;
  long local_50;
  memory_order local_48;
  int local_44;
  memory_order __b;
  undefined4 local_34;
  long local_30;
  undefined8 local_28;
  undefined4 local_1c;
  undefined8 local_18;
  atomic<long> *local_10;
  
  pbStack_e8 = v._M_ptr;
  k_local.field_0.key._M_ptr = (pointer)k.field_0._8_8_;
  inode_local._4_4_ = depth.value;
  child_in_parent._7_1_ = key_byte;
  pbStack_f8 = &inode->
                super_olc_inode_16_parent<std::span<const_std::byte>,_std::span<const_std::byte>_>;
  fVar5 = olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          ::find_child(inode,key_byte);
  local_108 = fVar5.second;
  if (local_108 ==
      (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *)0x0) {
    k_00.field_0.key._M_extent._M_extent_value =
         (__extent_storage<18446744073709551615UL>)
         (__extent_storage<18446744073709551615UL>)k_local.field_0.key._M_ptr;
    k_00.field_0.key._M_ptr = (pointer)k.field_0._0_8_;
    v_00._M_extent._M_extent_value = v._M_extent._M_extent_value._M_extent_value;
    v_00._M_ptr = pbStack_e8;
    create_leaf_if_needed<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
              (cached_leaf,k_00,v_00,db_instance);
    children_count_ =
         basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
         ::get_children_count
                   ((basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                     *)pbStack_f8);
    if (children_count_ == '\x10') {
      basic_inode<unodb::detail::basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>,17u,48u,(unodb::node_type)3,unodb::detail::olc_inode_16<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>,unodb::detail::olc_inode_256<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>,unodb::detail::olc_inode_48<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
      ::
      create<unodb::detail::olc_inode_16<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>&>
                ((basic_inode<unodb::detail::basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>,17u,48u,(unodb::node_type)3,unodb::detail::olc_inode_16<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>,unodb::detail::olc_inode_256<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>,unodb::detail::olc_inode_48<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
                  *)&write_unlock_on_exit_1,db_instance,
                 (olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                  *)pbStack_f8);
      optimistic_lock::write_guard::write_guard(&local_158,parent_critical_section);
      bVar1 = optimistic_lock::write_guard::must_restart(&local_158);
      if (bVar1) {
        std::
        optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
        ::optional((optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
                    *)&k_local.field_0.key._M_extent);
        node_write_guard.lock._4_4_ = 1;
      }
      else {
        optimistic_lock::write_guard::write_guard(&local_168,node_critical_section);
        bVar1 = optimistic_lock::write_guard::must_restart(&local_168);
        if (bVar1) {
          std::
          optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
          ::optional((optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
                      *)&k_local.field_0.key._M_extent);
          node_write_guard.lock._4_4_ = 1;
        }
        else {
          poVar2 = std::
                   unique_ptr<unodb::detail::olc_inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                   ::operator->((unique_ptr<unodb::detail::olc_inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                                 *)&write_unlock_on_exit_1);
          olc_inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          ::init(poVar2,(EVP_PKEY_CTX *)db_instance);
          poVar2 = std::
                   unique_ptr<unodb::detail::olc_inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                   ::release((unique_ptr<unodb::detail::olc_inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                              *)&write_unlock_on_exit_1);
          basic_node_ptr<unodb::detail::olc_node_header>::basic_node_ptr
                    ((basic_node_ptr<unodb::detail::olc_node_header> *)&write_unlock_on_exit,
                     (header_type *)poVar2,I48);
          in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>::
          operator=(node_in_parent,
                    (basic_node_ptr<unodb::detail::olc_node_header>)write_unlock_on_exit.lock);
          bVar1 = optimistic_lock::write_guard::active(&local_168);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            __assert_fail("!node_write_guard.active()",
                          "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                          ,0x5b8,
                          "static std::optional<in_critical_section<olc_node_ptr> *> unodb::detail::olc_impl_helpers::add_or_choose_subtree(INode &, std::byte, basic_art_key<Key>, value_view, olc_db<Key, Value> &, tree_depth<basic_art_key<Key>>, optimistic_lock::read_critical_section &, in_critical_section<olc_node_ptr> *, optimistic_lock::read_critical_section &, olc_db_leaf_unique_ptr<Key, Value> &) [Key = std::span<const std::byte>, Value = std::span<const std::byte>, INode = unodb::detail::olc_inode_16<std::span<const std::byte>, std::span<const std::byte>>]"
                         );
          }
          node_write_guard.lock._4_4_ = 0;
        }
        optimistic_lock::write_guard::~write_guard(&local_168);
      }
      optimistic_lock::write_guard::~write_guard(&local_158);
      if (node_write_guard.lock._4_4_ == 0) {
        olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
        ::account_growing_inode<(unodb::node_type)3>(db_instance);
        std::
        optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
        ::
        optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*const,_true>
                  ((optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
                    *)&k_local.field_0.key._M_extent,&local_108);
        node_write_guard.lock._4_4_ = 1;
      }
      std::
      unique_ptr<unodb::detail::olc_inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      ::~unique_ptr((unique_ptr<unodb::detail::olc_inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                     *)&write_unlock_on_exit_1);
      uVar4 = extraout_RDX;
      goto LAB_001e045f;
    }
    optimistic_lock::write_guard::write_guard(&local_180,node_critical_section);
    bVar1 = optimistic_lock::write_guard::must_restart(&local_180);
    if (bVar1) {
      std::
      optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
      ::optional((optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
                  *)&k_local.field_0.key._M_extent);
      node_write_guard.lock._4_4_ = 1;
    }
    else {
      this = parent_critical_section->lock;
      local_68.version = (parent_critical_section->version).version;
      paVar3 = &this->read_lock_count;
      local_44 = 2;
      ___b = paVar3;
      local_48 = std::operator&(acquire,__memory_order_mask);
      if (local_44 - 1U < 2) {
        local_50 = (paVar3->super___atomic_base<long>)._M_i;
      }
      else if (local_44 == 5) {
        local_50 = (paVar3->super___atomic_base<long>)._M_i;
      }
      else {
        local_50 = (paVar3->super___atomic_base<long>)._M_i;
      }
      if (local_50 < 1) {
        __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                      ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
      }
      local_34 = 2;
      other = optimistic_lock::atomic_version_type::load_relaxed(&this->version);
      bVar1 = optimistic_lock::version_type::operator==(&local_68,other);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        optimistic_lock::dec_read_lock_count(this);
      }
      if (bVar1) {
        local_10 = &this->read_lock_count;
        local_18 = 1;
        local_1c = 3;
        local_28 = 1;
        LOCK();
        local_60 = (local_10->super___atomic_base<long>)._M_i;
        (local_10->super___atomic_base<long>)._M_i = (local_10->super___atomic_base<long>)._M_i + -1
        ;
        UNLOCK();
        old_value = (__int_type_conflict)this;
        local_30 = local_60;
        if (local_60 < 1) {
          __assert_fail("old_value > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                        ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
        }
      }
      parent_critical_section->lock = (optimistic_lock *)0x0;
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        basic_inode_16<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
        ::add_to_nonfull(pbStack_f8,cached_leaf,inode_local._4_4_,children_count_);
        node_write_guard.lock._4_4_ = 0;
      }
      else {
        std::
        optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
        ::optional((optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
                    *)&k_local.field_0.key._M_extent);
        node_write_guard.lock._4_4_ = 1;
      }
    }
    optimistic_lock::write_guard::~write_guard(&local_180);
    uVar4 = extraout_RDX_00;
    if (node_write_guard.lock._4_4_ != 0) goto LAB_001e045f;
  }
  std::
  optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
  ::
  optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*const,_true>
            ((optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
              *)&k_local.field_0.key._M_extent,&local_108);
  uVar4 = extraout_RDX_01;
LAB_001e045f:
  oVar6.
  super__Optional_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true>
  ._M_payload.
  super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
  ._9_7_ = (undefined7)((ulong)uVar4 >> 8);
  oVar6.
  super__Optional_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true>
  ._M_payload.
  super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
  ._M_engaged = (bool)local_c0;
  oVar6.
  super__Optional_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true>
  ._M_payload.
  super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
  ._M_payload = (_Storage<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true>
                 )k_local.field_0.key._M_extent._M_extent_value;
  return (optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
          )oVar6.
           super__Optional_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true>
           ._M_payload.
           super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
  ;
}

Assistant:

[[nodiscard]] std::optional<in_critical_section<olc_node_ptr>*>
olc_impl_helpers::add_or_choose_subtree(
    INode& inode, std::byte key_byte, basic_art_key<Key> k, value_view v,
    olc_db<Key, Value>& db_instance, tree_depth<basic_art_key<Key>> depth,
    optimistic_lock::read_critical_section& node_critical_section,
    in_critical_section<olc_node_ptr>* node_in_parent,
    optimistic_lock::read_critical_section& parent_critical_section,
    olc_db_leaf_unique_ptr<Key, Value>& cached_leaf) {
  auto* const child_in_parent = inode.find_child(key_byte).second;

  if (child_in_parent == nullptr) {
    create_leaf_if_needed(cached_leaf, k, v, db_instance);

    const auto children_count = inode.get_children_count();

    if constexpr (!std::is_same_v<INode, olc_inode_256<Key, Value>>) {
      if (UNODB_DETAIL_UNLIKELY(children_count == INode::capacity)) {
        auto larger_node{
            INode::larger_derived_type::create(db_instance, inode)};
        {
          const optimistic_lock::write_guard write_unlock_on_exit{
              std::move(parent_critical_section)};
          if (UNODB_DETAIL_UNLIKELY(write_unlock_on_exit.must_restart()))
            return {};  // LCOV_EXCL_LINE

          optimistic_lock::write_guard node_write_guard{
              std::move(node_critical_section)};
          if (UNODB_DETAIL_UNLIKELY(node_write_guard.must_restart())) return {};

          larger_node->init(db_instance, inode, node_write_guard,
                            std::move(cached_leaf), depth);
          *node_in_parent = detail::olc_node_ptr{
              larger_node.release(), INode::larger_derived_type::type};

          UNODB_DETAIL_ASSERT(!node_write_guard.active());
        }

#ifdef UNODB_DETAIL_WITH_STATS
        db_instance
            .template account_growing_inode<INode::larger_derived_type::type>();
#endif  // UNODB_DETAIL_WITH_STATS

        return child_in_parent;
      }
    }

    const optimistic_lock::write_guard write_unlock_on_exit{
        std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(write_unlock_on_exit.must_restart())) return {};

    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    inode.add_to_nonfull(std::move(cached_leaf), depth, children_count);
  }

  return child_in_parent;
}